

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int is_nested(dmr_C *C,token *token,token **p,int prefer_abstract)

{
  int iVar1;
  token *token_00;
  token *next;
  int prefer_abstract_local;
  token **p_local;
  token *token_local;
  dmr_C *C_local;
  
  token_00 = skip_attributes(C,token->next);
  *p = token_00;
  if ((SUB84(token_00->pos,0) & 0x3f) == 2) {
    iVar1 = dmrC_lookup_type(token_00);
    if (iVar1 == 0) {
      C_local._4_4_ = 1;
    }
    else {
      C_local._4_4_ = (uint)((prefer_abstract != 0 ^ 0xffU) & 1);
    }
  }
  else {
    iVar1 = dmrC_match_op(token_00,0x29);
    if ((iVar1 == 0) && (iVar1 = dmrC_match_op(token_00,0x117), iVar1 == 0)) {
      return 1;
    }
    C_local._4_4_ = 0;
  }
  return C_local._4_4_;
}

Assistant:

static int is_nested(struct dmr_C *C, struct token *token, struct token **p,
		    int prefer_abstract)
{
	/*
	 * This can be either a parameter list or a grouping.
	 * For the direct (non-abstract) case, we know if must be
	 * a parameter list if we already saw the identifier.
	 * For the abstract case, we know if must be a parameter
	 * list if it is empty or starts with a type.
	 */
	struct token *next = token->next;

	*p = next = skip_attributes(C, next);

	if (dmrC_token_type(next) == TOKEN_IDENT) {
		if (dmrC_lookup_type(next))
			return !prefer_abstract;
		return 1;
	}

	if (dmrC_match_op(next, ')') || dmrC_match_op(next, SPECIAL_ELLIPSIS))
		return 0;

	return 1;
}